

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O1

void rw::decompressDXT3(uint8 *adst,int32 w,int32 h,uint8 *src)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  uint32 *puVar12;
  int32 k;
  long lVar13;
  ulong uVar14;
  uint32 *puVar15;
  uint32 k_2;
  long lVar16;
  int iVar17;
  int iVar18;
  uint local_98 [4];
  uint local_88;
  uint local_84;
  uint local_80;
  uint local_78;
  uint local_74;
  uint local_70;
  uint32 c [4] [4];
  uint8 a [16];
  uint8 idx [16];
  
  if (0 < h * w) {
    uVar14 = 0;
    iVar9 = 0;
    iVar17 = 0;
    do {
      uVar1 = *(ushort *)(src + uVar14 + 8);
      uVar2 = *(ushort *)(src + uVar14 + 10);
      uVar10 = (uint)(uVar1 >> 0xb) * 0xff;
      local_98[0] = uVar10 / 0x1f;
      uVar3 = (uVar1 >> 5 & 0x3f) * 0xff;
      local_98[1] = uVar3 / 0x3f;
      uVar4 = (uVar1 & 0x1f) * 0xff;
      local_98[2] = uVar4 / 0x1f;
      uVar5 = (uint)(uVar2 >> 0xb) * 0xff;
      local_88 = uVar5 / 0x1f;
      uVar6 = (uVar2 >> 5 & 0x3f) * 0xff;
      local_84 = uVar6 / 0x3f;
      uVar7 = (uVar2 & 0x1f) * 0xff;
      local_80 = uVar7 / 0x1f;
      local_78 = (local_88 + local_98[0] * 2) / 3;
      local_74 = (local_84 + local_98[1] * 2) / 3;
      local_70 = (local_80 + local_98[2] * 2) / 3;
      c[0][0] = (uVar10 / 0x1f + (uVar5 / 0x1f) * 2) / 3;
      c[0][1] = (uVar3 / 0x3f + (uVar6 / 0x3f) * 2) / 3;
      c[0][2] = (uVar4 / 0x1f + (uVar7 / 0x1f) * 2) / 3;
      uVar10 = *(uint *)(src + uVar14 + 0xc);
      lVar13 = 0;
      do {
        *(byte *)((long)c[2] + lVar13) = (byte)uVar10 & 3;
        uVar10 = uVar10 >> 2;
        lVar13 = lVar13 + 1;
      } while (lVar13 != 0x10);
      uVar11 = *(ulong *)(src + uVar14);
      lVar13 = 0;
      do {
        *(byte *)((long)c[1] + lVar13) = ((byte)uVar11 & 0xf) * '\x11';
        uVar11 = uVar11 >> 4;
        lVar13 = lVar13 + 1;
      } while (lVar13 != 0x10);
      iVar18 = w * iVar17 + iVar9;
      puVar12 = c[1];
      puVar15 = c[2];
      lVar13 = 0;
      do {
        lVar16 = 0;
        do {
          uVar11 = (ulong)*(byte *)((long)puVar15 + lVar16);
          uVar8 = (ulong)(uint)(iVar18 + (int)lVar16);
          adst[uVar8 * 4] = (uint8)local_98[uVar11 * 4];
          adst[uVar8 * 4 + 1] = (uint8)local_98[uVar11 * 4 + 1];
          adst[uVar8 * 4 + 2] = (uint8)local_98[uVar11 * 4 + 2];
          adst[uVar8 * 4 + 3] = *(uint8 *)((long)puVar12 + lVar16);
          lVar16 = lVar16 + 1;
        } while (lVar16 != 4);
        lVar13 = lVar13 + 1;
        iVar18 = iVar18 + w;
        puVar15 = puVar15 + 1;
        puVar12 = puVar12 + 1;
      } while (lVar13 != 4);
      iVar9 = iVar9 + 4;
      if (w <= iVar9) {
        iVar9 = 0;
        iVar17 = iVar17 + 4;
      }
      uVar14 = uVar14 + 0x10;
    } while (uVar14 < (uint)(h * w));
  }
  return;
}

Assistant:

void
decompressDXT3(uint8 *adst, int32 w, int32 h, uint8 *src)
{
	/* j loops through old texels
	 * x and y loop through new texels */
	int32 x = 0, y = 0;
	uint32 c[4][4];
	uint8 idx[16];
	uint8 a[16];
	uint8 (*dst)[4] = (uint8(*)[4])adst;
	for(int32 j = 0; j < w*h; j += 16){
		/* calculate colors */
		uint32 col0 = *((uint16*)&src[j+8]);
		uint32 col1 = *((uint16*)&src[j+10]);
		c[0][0] = ((col0>>11) & 0x1F)*0xFF/0x1F;
		c[0][1] = ((col0>> 5) & 0x3F)*0xFF/0x3F;
		c[0][2] = ( col0      & 0x1F)*0xFF/0x1F;

		c[1][0] = ((col1>>11) & 0x1F)*0xFF/0x1F;
		c[1][1] = ((col1>> 5) & 0x3F)*0xFF/0x3F;
		c[1][2] = ( col1      & 0x1F)*0xFF/0x1F;

		c[2][0] = (2*c[0][0] + 1*c[1][0])/3;
		c[2][1] = (2*c[0][1] + 1*c[1][1])/3;
		c[2][2] = (2*c[0][2] + 1*c[1][2])/3;

		c[3][0] = (1*c[0][0] + 2*c[1][0])/3;
		c[3][1] = (1*c[0][1] + 2*c[1][1])/3;
		c[3][2] = (1*c[0][2] + 2*c[1][2])/3;

		/* make index list */
		uint32 indices = *((uint32*)&src[j+12]);
		for(int32 k = 0; k < 16; k++){
			idx[k] = indices & 0x3;
			indices >>= 2;
		}
		uint64 alphas = *((uint64*)&src[j+0]);
		for(int32 k = 0; k < 16; k++){
			a[k] = (alphas & 0xF)*17;
			alphas >>= 4;
		}

		/* write bytes */
		for(uint32 l = 0; l < 4; l++)
			for(uint32 k = 0; k < 4; k++){
				dst[(y+l)*w + x+k][0] = c[idx[l*4+k]][0];
				dst[(y+l)*w + x+k][1] = c[idx[l*4+k]][1];
				dst[(y+l)*w + x+k][2] = c[idx[l*4+k]][2];
				dst[(y+l)*w + x+k][3] = a[l*4+k];
			}
		x += 4;
		if(x >= w){
			y += 4;
			x = 0;
		}
	}
}